

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O1

void Am_Scripting_Register_Palette
               (Am_Object *undo_handler,Am_Object *palette,Am_Value *slot_or_type)

{
  Am_Slot_Key key;
  Am_Value *list_value;
  Am_Wrapper *pAVar1;
  ostream *poVar2;
  Am_Assoc as;
  Am_Value_List palette_registry;
  Am_Assoc local_40;
  Am_Value_List local_38;
  
  if (slot_or_type->type == 0x4015) {
    Am_Object::Set(palette,0x19c,slot_or_type,1);
  }
  list_value = Am_Object::Get(undo_handler,Am_REGISTRY_FOR_PALETTES,3);
  Am_Value_List::Am_Value_List(&local_38,list_value);
  pAVar1 = Am_Object::operator_cast_to_Am_Wrapper_(palette);
  Am_Assoc::Am_Assoc(&local_40,pAVar1,slot_or_type);
  pAVar1 = Am_Assoc::operator_cast_to_Am_Wrapper_(&local_40);
  Am_Value_List::Add(&local_38,pAVar1,Am_TAIL,true);
  key = Am_REGISTRY_FOR_PALETTES;
  pAVar1 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_38);
  Am_Object::Set(undo_handler,key,pAVar1,1);
  if (am_sdebug == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Registering palette ",0x14);
    poVar2 = operator<<((ostream *)&std::cout,palette);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," for ",5);
    poVar2 = operator<<(poVar2,slot_or_type);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," to ",4);
    poVar2 = operator<<(poVar2,undo_handler);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," got new list ",0xe);
    poVar2 = operator<<(poVar2,&local_38);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::ostream::flush();
  }
  Am_Assoc::~Am_Assoc(&local_40);
  Am_Value_List::~Am_Value_List(&local_38);
  return;
}

Assistant:

void
Am_Scripting_Register_Palette(Am_Object undo_handler, Am_Object palette,
                              Am_Value slot_or_type)
{
  if (Am_Am_Slot_Key::Test(slot_or_type)) {
    palette.Set(Am_SLOT_FOR_VALUE, slot_or_type, Am_OK_IF_NOT_THERE);
  }
  Am_Value_List palette_registry =
      undo_handler.Get(Am_REGISTRY_FOR_PALETTES, Am_RETURN_ZERO_ON_ERROR);
  Am_Assoc as(palette, slot_or_type);
  palette_registry.Add(as);
  undo_handler.Set(Am_REGISTRY_FOR_PALETTES, palette_registry,
                   Am_OK_IF_NOT_THERE);
  if (am_sdebug)
    std::cout << "Registering palette " << palette << " for " << slot_or_type
              << " to " << undo_handler << " got new list " << palette_registry
              << std::endl
              << std::flush;
}